

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

size_t uv_utf16_length_as_wtf8(uint16_t *w_source_ptr,ssize_t w_source_len)

{
  int32_t iVar1;
  size_t sStack_20;
  int32_t code_point;
  size_t target_len;
  ssize_t w_source_len_local;
  uint16_t *w_source_ptr_local;
  
  sStack_20 = 0;
  target_len = w_source_len;
  w_source_len_local = (ssize_t)w_source_ptr;
  while( true ) {
    if (target_len == 0) {
      return sStack_20;
    }
    iVar1 = uv__get_surrogate_value((uint16_t *)w_source_len_local,target_len);
    if (iVar1 < 0) break;
    if (((long)target_len < 0) && (iVar1 == 0)) {
      return sStack_20;
    }
    if (iVar1 < 0x80) {
      sStack_20 = sStack_20 + 1;
    }
    else if (iVar1 < 0x800) {
      sStack_20 = sStack_20 + 2;
    }
    else if (iVar1 < 0x10000) {
      sStack_20 = sStack_20 + 3;
    }
    else {
      sStack_20 = sStack_20 + 4;
      w_source_len_local = w_source_len_local + 2;
      if (0 < (long)target_len) {
        target_len = target_len - 1;
      }
    }
    w_source_len_local = w_source_len_local + 2;
    if (0 < (long)target_len) {
      target_len = target_len - 1;
    }
  }
  __assert_fail("code_point >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/../src/idna.c"
                ,0x1b4,"size_t uv_utf16_length_as_wtf8(const uint16_t *, ssize_t)");
}

Assistant:

size_t uv_utf16_length_as_wtf8(const uint16_t* w_source_ptr,
                               ssize_t w_source_len) {
  size_t target_len;
  int32_t code_point;

  target_len = 0;
  while (w_source_len) {
    code_point = uv__get_surrogate_value(w_source_ptr, w_source_len);
    /* Can be invalid UTF-8 but must be valid WTF-8. */
    assert(code_point >= 0);
    if (w_source_len < 0 && code_point == 0)
      break;
    if (code_point < 0x80)
      target_len += 1;
    else if (code_point < 0x800)
      target_len += 2;
    else if (code_point < 0x10000)
      target_len += 3;
    else {
      target_len += 4;
      w_source_ptr++;
      if (w_source_len > 0)
        w_source_len--;
    }
    w_source_ptr++;
    if (w_source_len > 0)
      w_source_len--;
  }

  return target_len;
}